

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleClient.cpp
# Opt level: O2

void __thiscall CustomClient::~CustomClient(CustomClient *this)

{
  blcl::net::client_interface<MsgType>::~client_interface(&this->super_client_interface<MsgType>);
  operator_delete(this,0x150);
  return;
}

Assistant:

void ping_server() {
        blcl::net::message<MsgType> msg;
        msg.header.id = MsgType::ServerPing;

        std::chrono::system_clock::time_point now = std::chrono::system_clock::now();
        std::cout << sizeof(now) << "\n";
        msg << now;
        send(msg);
    }